

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_meta___newindex(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  CType *ct;
  CTState *cts;
  CTInfo qual;
  uint8_t *p;
  CTInfo local_2c;
  uint8_t *local_28;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  local_2c = 0;
  pTVar1 = L->base;
  if ((pTVar1 + 2 < L->top) && ((pTVar1->field_2).it == 0xfffffff5)) {
    ct = lj_cdata_index(cts,(GCcdata *)(ulong)(pTVar1->u32).lo,pTVar1 + 1,&local_28,&local_2c);
    if ((local_2c & 1) == 0) {
      lj_cdata_set(cts,ct,local_28,pTVar1 + 2,local_2c);
      iVar2 = 0;
    }
    else {
      if ((local_2c >> 0x19 & 1) != 0) {
        lj_err_caller(L,LJ_ERR_FFI_WRCONST);
      }
      iVar2 = ffi_index_meta(L,cts,ct,MM_newindex);
    }
    return iVar2;
  }
  lj_err_argt(L,1,10);
}

Assistant:

LJLIB_CF(ffi_meta___newindex)	LJLIB_REC(cdata_index 1)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+2 < L->top && tviscdata(o)))  /* Also checks for key and value. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1)) {
    if ((qual & CTF_CONST))
      lj_err_caller(L, LJ_ERR_FFI_WRCONST);
    return ffi_index_meta(L, cts, ct, MM_newindex);
  }
  lj_cdata_set(cts, ct, p, o+2, qual);
  return 0;
}